

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_status_code.hpp
# Opt level: O3

bool __thiscall
system_error2::detail::
indirecting_domain<system_error2::status_code<system_error2::_posix_code_domain>,_std::allocator<system_error2::status_code<system_error2::_posix_code_domain>_>_>
::_do_equivalent(indirecting_domain<system_error2::status_code<system_error2::_posix_code_domain>,_std::allocator<system_error2::status_code<system_error2::_posix_code_domain>_>_>
                 *this,status_code<void> *code1,status_code<void> *code2)

{
  bool bVar1;
  _posix_code_domain local_10;
  
  if (code1->_domain->_id == (this->super_status_code_domain)._id) {
    local_10.super_status_code_domain._id = 0xa59a56fe5f310933;
    local_10.super_status_code_domain._vptr_status_code_domain = (_func_int **)&PTR_name_00113c10;
    bVar1 = _posix_code_domain::_do_equivalent
                      (&local_10,(status_code<void> *)code1[1]._domain,code2);
    return bVar1;
  }
  __assert_fail("code1.domain() == *this",
                "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/nested_status_code.hpp"
                ,0x67,
                "virtual bool system_error2::detail::indirecting_domain<system_error2::status_code<system_error2::_posix_code_domain>, std::allocator<system_error2::status_code<system_error2::_posix_code_domain>>>::_do_equivalent(const status_code<void> &, const status_code<void> &) const [StatusCode = system_error2::status_code<system_error2::_posix_code_domain>, Allocator = std::allocator<system_error2::status_code<system_error2::_posix_code_domain>>]"
               );
}

Assistant:

virtual bool _do_equivalent(const status_code<void> &code1, const status_code<void> &code2) const noexcept override  // NOLINT
    {
      assert(code1.domain() == *this);
      const auto &c1 = static_cast<const _mycode &>(code1);  // NOLINT
      return static_cast<status_code_domain &&>(typename StatusCode::domain_type())._do_equivalent(c1.value()->sc, code2);
    }